

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  treeNode *tree_00;
  treeNode *tree;
  ifstream file;
  string local_28 [8];
  string path;
  
  this = std::operator<<((ostream *)&std::cout,"Please input the script path:");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_28);
  std::operator>>((istream *)&std::cin,local_28);
  std::ifstream::ifstream(&tree,local_28,8);
  tree_00 = parse((istream *)&tree);
  Executor::execute(tree_00);
  std::ifstream::close();
  std::ifstream::~ifstream(&tree);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main()
{
    cout<<"Please input the script path:"<<endl;
    string path;
    cin>>path;
    ifstream file(path);
    treeNode* tree=parse(file);
    Executor::execute(tree);
    file.close();
}